

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutex.h
# Opt level: O0

void icu_63::umtx_initOnce<icu_63::OlsonTimeZone*>
               (UInitOnce *uio,_func_void_OlsonTimeZone_ptr_UErrorCode_ptr *fp,
               OlsonTimeZone *context,UErrorCode *errCode)

{
  UBool UVar1;
  int32_t iVar2;
  UErrorCode *errCode_local;
  OlsonTimeZone *context_local;
  _func_void_OlsonTimeZone_ptr_UErrorCode_ptr *fp_local;
  UInitOnce *uio_local;
  
  UVar1 = ::U_FAILURE(*errCode);
  if (UVar1 == '\0') {
    iVar2 = umtx_loadAcquire(&uio->fState);
    if ((iVar2 == 2) || (UVar1 = umtx_initImplPreInit(uio), UVar1 == '\0')) {
      UVar1 = ::U_FAILURE(uio->fErrCode);
      if (UVar1 != '\0') {
        *errCode = uio->fErrCode;
      }
    }
    else {
      (*fp)(context,errCode);
      uio->fErrCode = *errCode;
      umtx_initImplPostInit(uio);
    }
  }
  return;
}

Assistant:

void umtx_initOnce(UInitOnce &uio, void (U_CALLCONV *fp)(T, UErrorCode &), T context, UErrorCode &errCode) {
    if (U_FAILURE(errCode)) {
        return;
    }
    if (umtx_loadAcquire(uio.fState) != 2 && umtx_initImplPreInit(uio)) {
        // We run the initialization.
        (*fp)(context, errCode);
        uio.fErrCode = errCode;
        umtx_initImplPostInit(uio);
    } else {
        // Someone else already ran the initialization.
        if (U_FAILURE(uio.fErrCode)) {
            errCode = uio.fErrCode;
        }
    }
}